

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<6,_2,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  long lVar1;
  float afStack_30 [2];
  ulong local_28;
  float local_20;
  int aiStack_18 [6];
  
  local_28 = CONCAT44(evalCtx->in[1].m_data[0],evalCtx->in[0].m_data[0]) ^ 0x8000000080000000;
  local_20 = -evalCtx->in[0].m_data[1] - evalCtx->in[1].m_data[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }